

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteBatch::SQLiteBatch(SQLiteBatch *this,SQLiteDatabase *database)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  DatabaseBatch *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DatabaseBatch::DatabaseBatch(in_stack_ffffffffffffffb8);
  *in_RDI = &PTR_ReadKey_016166f0;
  in_RDI[1] = in_RSI;
  std::make_unique<wallet::SQliteExecHandler>();
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  if (*(long *)(in_RDI[1] + 200) == 0) {
    __assert_fail("m_database.m_db",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x193,"wallet::SQLiteBatch::SQLiteBatch(SQLiteDatabase &)");
  }
  SetupSQLStatements((SQLiteBatch *)database);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteBatch::SQLiteBatch(SQLiteDatabase& database)
    : m_database(database)
{
    // Make sure we have a db handle
    assert(m_database.m_db);

    SetupSQLStatements();
}